

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
  *this;
  int iVar1;
  int *piVar2;
  undefined **__n;
  void *__buf;
  int iVar3;
  shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>
  *__args_1;
  char *__end;
  thread t;
  shared_ptr<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>_>
  executor;
  once_flag once;
  shared_ptr<boost::asio::io_context> ctx;
  shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>
  stream;
  context ssl_ctx;
  async_session session;
  url url;
  long local_2d0;
  timespec local_2c8;
  reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
  *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  once_flag local_2a4;
  io_context *local_2a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
  *local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>
  local_280;
  shared_ptr<boost::asio::io_context> local_270;
  context local_260;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  string local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
  local_1e8;
  url local_1b0;
  url local_f0;
  
  boost::asio::ssl::context::context(&local_260,tlsv12_client);
  local_2a4._M_once = 0;
  m2d::root_cert_abi_cxx11_();
  std::
  call_once<void(&)(std::__cxx11::string_const&,boost::asio::ssl::context&),std::__cxx11::string_const,boost::asio::ssl::context&>
            (&local_2a4,m2d::savanna::load_root_cert,&local_1b0.scheme_,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.scheme_._M_dataplus._M_p != &local_1b0.scheme_.field_2) {
    operator_delete(local_1b0.scheme_._M_dataplus._M_p);
  }
  local_2a0 = (io_context *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::asio::io_context,std::allocator<boost::asio::io_context>>
            (&local_298,&local_2a0,(allocator<boost::asio::io_context> *)&local_1b0);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"ws://localhost:80","");
  m2d::savanna::url::url(&local_1b0,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  local_290 = (stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
               *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true>,std::allocator<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true>>,boost::asio::io_context&>
            (&local_288,&local_290,
             (allocator<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>
              *)&local_1e8,local_2a0);
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl._0_8_ = 0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_270.super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_2a0;
  local_270.super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_298._M_pi;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
    }
  }
  local_280.
  super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_290;
  local_280.
  super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_288._M_pi;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
    }
  }
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  m2d::savanna::url::url(&local_f0,&local_1b0);
  local_2b8 = (reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
               *)0x0;
  __args_1 = &local_280;
  local_2c8.tv_sec = (__time_t)&local_1e8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true>>>,std::allocator<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic___11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ssl_session_st>>>>*>
            (&local_2b0,&local_2b8,
             (allocator<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>_>
              *)&local_2d0,&local_270,__args_1,&local_f0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
              **)&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.fragment_._M_dataplus._M_p != &local_f0.fragment_.field_2) {
    operator_delete(local_f0.fragment_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.query_._M_dataplus._M_p != &local_f0.query_.field_2) {
    operator_delete(local_f0.query_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.path_._M_dataplus._M_p != &local_f0.path_.field_2) {
    operator_delete(local_f0.path_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.port_._M_dataplus._M_p != &local_f0.port_.field_2) {
    operator_delete(local_f0.port_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.host_._M_dataplus._M_p != &local_f0.host_.field_2) {
    operator_delete(local_f0.host_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.scheme_._M_dataplus._M_p != &local_f0.scheme_.field_2) {
    operator_delete(local_f0.scheme_._M_dataplus._M_p);
  }
  if (local_280.
      super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.
               super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_270.super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/0x0c[P]savanna/example/async_websocket/main.cpp:32:23)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/0x0c[P]savanna/example/async_websocket/main.cpp:32:23)>
              ::_M_manager;
  boost::optional_detail::
  optional_base<std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>_>::
  assign(&(local_2b8->on_message_handler_).super_type,(argument_type)&local_248);
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  local_2d0 = 0;
  local_2c8.tv_sec = (__time_t)operator_new(0x10);
  __n = &PTR___State_0024bcf8;
  *(undefined ***)local_2c8.tv_sec = &PTR___State_0024bcf8;
  *(reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
    ***)(local_2c8.tv_sec + 8) = &local_2b8;
  std::thread::_M_start_thread(&local_2d0,&local_2c8,0);
  if ((long *)local_2c8.tv_sec != (long *)0x0) {
    (**(code **)(*(long *)local_2c8.tv_sec + 8))();
  }
  std::thread::detach();
  iVar3 = 3;
  do {
    if (local_2b8->current_state_ == connected) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"send: hello",0xb);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        this = local_2b8;
        local_228[0] = local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"hello","");
        m2d::savanna::async_websocket::
        reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
        ::send(this,(int)(string *)local_228,__buf,(size_t)__n,(int)__args_1);
        if (local_228[0] != local_218) {
          operator_delete(local_228[0]);
        }
        local_2c8.tv_sec = 1;
        local_2c8.tv_nsec = 0;
        do {
          iVar3 = nanosleep(&local_2c8,&local_2c8);
          if (iVar3 != -1) break;
          piVar2 = __errno_location();
        } while (*piVar2 == 4);
      } while (local_2b8->current_state_ == connected);
      iVar3 = 0;
      goto LAB_00111641;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connecting...",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    local_2c8.tv_sec = 1;
    local_2c8.tv_nsec = 0;
    do {
      iVar1 = nanosleep(&local_2c8,&local_2c8);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = -1;
LAB_00111641:
  if (local_2d0 == 0) {
    if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
    ::~_Rb_tree(&local_1e8);
    if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.fragment_._M_dataplus._M_p != &local_1b0.fragment_.field_2) {
      operator_delete(local_1b0.fragment_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.query_._M_dataplus._M_p != &local_1b0.query_.field_2) {
      operator_delete(local_1b0.query_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.path_._M_dataplus._M_p != &local_1b0.path_.field_2) {
      operator_delete(local_1b0.path_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.port_._M_dataplus._M_p != &local_1b0.port_.field_2) {
      operator_delete(local_1b0.port_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.host_._M_dataplus._M_p != &local_1b0.host_.field_2) {
      operator_delete(local_1b0.host_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.scheme_._M_dataplus._M_p != &local_1b0.scheme_.field_2) {
      operator_delete(local_1b0.scheme_._M_dataplus._M_p);
    }
    if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298._M_pi);
    }
    boost::asio::ssl::context::~context(&local_260);
    return iVar3;
  }
  std::terminate();
}

Assistant:

int main(int argc, char *argv[])
{
	ssl::context ssl_ctx(ssl::context::tlsv12_client);
	std::once_flag once;
	std::call_once(once, savanna::load_root_cert, m2d::root_cert(), ssl_ctx);

	auto ctx = std::make_shared<net::io_context>();

	// savanna::url url("ws://echo.websocket.org");
	// auto stream = savanna::websocket::raw_stream(ctx);
	// savanna::websocket::session<savanna::websocket::raw_stream> session(std::move(resolver), std::move(stream), url);

	savanna::url url("ws://localhost:80");
	auto stream = std::make_shared<savanna::async_websocket::raw_stream>(*ctx);
	savanna::async_websocket::async_session session;

	auto executor = session.prepare(ctx, stream, url);

	executor->on_message([](beast::flat_buffer buffer) {
		std::cout << "received: " << beast::make_printable(buffer.data()) << std::endl;
	});

	std::thread t([&]() {
		try {
			executor->run();
		} catch (boost::system::system_error e) {
			std::cout << "Error: " << e.what() << std::endl;
		}
	});
	t.detach();

	int retry_count = 3;
	while (executor->current_state() != savanna::async_websocket::state::connected && retry_count > 0) {
		std::cout << "connecting..." << std::endl;
		std::this_thread::sleep_for(std::chrono::seconds(1));
		retry_count--;
		if (retry_count == 0) {
			return -1;
		}
	}

	while (executor->current_state() == savanna::async_websocket::state::connected) {
		std::cout << "send: hello" << std::endl;
		executor->send("hello");
		std::this_thread::sleep_for(std::chrono::seconds(1));
	}
	return 0;
}